

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int handle_certificate_verify(ptls_t *tls,ptls_iovec_t message,char *context_string)

{
  uint8_t *puVar1;
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *p_Var2;
  ptls_key_schedule_t *ppVar3;
  bool bVar4;
  ushort uVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  ulong unaff_RBP;
  uint8_t *puVar9;
  long lVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  ptls_hash_context_t **pppVar13;
  ptls_iovec_t pVar14;
  ptls_iovec_t pVar15;
  uint8_t signdata [226];
  uint8_t auStack_118 [232];
  
  sVar8 = message.len;
  puVar9 = message.base;
  if ((long)sVar8 < 6) {
    return 0x32;
  }
  uVar5 = *(ushort *)(puVar9 + 4) << 8 | *(ushort *)(puVar9 + 4) >> 8;
  puVar11 = puVar9 + 6;
  puVar1 = puVar9 + sVar8;
  iVar6 = 0x32;
  if (1 < (ulong)((long)puVar1 - (long)puVar11)) {
    lVar10 = 0;
    unaff_RBP = 0;
    do {
      unaff_RBP = (ulong)puVar11[lVar10] | unaff_RBP << 8;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 2);
    puVar12 = puVar9 + 8;
    puVar11 = puVar12;
    if (unaff_RBP <= (ulong)((long)puVar1 - (long)puVar12)) {
      puVar11 = puVar12 + unaff_RBP;
      bVar4 = true;
      iVar6 = 0;
      goto LAB_001194df;
    }
  }
  bVar4 = false;
  puVar12 = puVar11;
LAB_001194df:
  if (((bVar4) && (iVar6 = 0x32, puVar11 == puVar1)) &&
     ((uVar5 == 0x804 || (iVar6 = 0x2f, uVar5 == 0x403)))) {
    sVar7 = build_certificate_verify_signdata(auStack_118,tls->key_schedule,context_string);
    p_Var2 = (tls->certificate_verify).cb;
    if (p_Var2 == (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0) {
      iVar6 = 0;
    }
    else {
      pVar14.len = unaff_RBP;
      pVar14.base = puVar12;
      pVar15.len = sVar7;
      pVar15.base = auStack_118;
      iVar6 = (*p_Var2)((tls->certificate_verify).verify_ctx,pVar15,pVar14);
    }
    (*ptls_clear_memory)(auStack_118,sVar7);
    (tls->certificate_verify).cb = (_func_int_void_ptr_ptls_iovec_t_ptls_iovec_t *)0x0;
    if (iVar6 == 0) {
      ppVar3 = tls->key_schedule;
      if (ppVar3->num_hashes == 0) {
        iVar6 = 0;
      }
      else {
        pppVar13 = &ppVar3->hashes[0].ctx;
        iVar6 = 0;
        sVar7 = 0;
        do {
          (*(*pppVar13)->update)(*pppVar13,puVar9,sVar8);
          sVar7 = sVar7 + 1;
          pppVar13 = pppVar13 + 2;
        } while (sVar7 != ppVar3->num_hashes);
      }
    }
  }
  return iVar6;
}

Assistant:

static int handle_certificate_verify(ptls_t *tls, ptls_iovec_t message, const char *context_string)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    uint16_t algo;
    ptls_iovec_t signature;
    uint8_t signdata[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
    size_t signdata_size;
    int ret;

    /* decode */
    if ((ret = ptls_decode16(&algo, &src, end)) != 0)
        goto Exit;
    ptls_decode_block(src, end, 2, {
        signature = ptls_iovec_init(src, end - src);
        src = end;
    });

    /* validate */
    switch (algo) {
    case PTLS_SIGNATURE_RSA_PSS_RSAE_SHA256:
    case PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256:
        /* ok */
        break;
    default:
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }
    signdata_size = build_certificate_verify_signdata(signdata, tls->key_schedule, context_string);
    if (tls->certificate_verify.cb != NULL) {
        ret = tls->certificate_verify.cb(tls->certificate_verify.verify_ctx, ptls_iovec_init(signdata, signdata_size), signature);
    } else {
        ret = 0;
    }
    ptls_clear_memory(signdata, signdata_size);
    tls->certificate_verify.cb = NULL;
    if (ret != 0) {
        goto Exit;
    }

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

Exit:
    return ret;
}